

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O2

CreateAddressResponseStruct *
cfd::js::api::AddressApiBase::CreateAddress
          (CreateAddressResponseStruct *__return_storage_ptr__,CreateAddressRequestStruct *request,
          AddressFactory *address_factory)

{
  HashKeyDataStruct *pHVar1;
  string *__lhs;
  bool bVar2;
  char cVar3;
  AddressType AVar4;
  Script *this;
  Pubkey pubkey;
  Script redeem_script;
  Script locking_script;
  Script script;
  Address addr;
  undefined1 local_3f8 [24];
  undefined1 local_3e0 [80];
  Script local_390;
  Script local_358;
  Script local_320 [6];
  Address local_1a8 [376];
  
  CreateAddressResponseStruct::CreateAddressResponseStruct(__return_storage_ptr__);
  cfd::core::Address::Address(local_1a8);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_3f8);
  cfd::core::Script::Script(&local_358);
  cfd::core::Script::Script(&local_390);
  cfd::core::Script::Script((Script *)(local_3e0 + 0x18));
  AVar4 = ConvertAddressType(&request->hash_type);
  pHVar1 = &request->key_data;
  __lhs = &(request->key_data).type;
  bVar2 = std::operator==(__lhs,"pubkey");
  if (bVar2) {
    if ((AVar4 == kTaprootAddress) && ((request->key_data).hex._M_string_length == 0x40)) {
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_3e0,(string *)pHVar1);
      cfd::core::SchnorrPubkey::CreatePubkey(SUB81(local_320,0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f8,local_320);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
      this = (Script *)local_3e0;
    }
    else {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_320,(string *)pHVar1);
      this = local_320;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f8,this);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    bVar2 = std::operator==(__lhs,"redeem_script");
    if (bVar2) {
      cfd::core::Script::Script(local_320,(string *)pHVar1);
      cfd::core::Script::operator=(&local_358,local_320);
      core::Script::~Script(local_320);
    }
  }
  cfd::AddressFactory::CreateAddress
            ((AddressType)local_320,(Pubkey *)address_factory,(Script *)(ulong)AVar4,
             (Script *)local_3f8,&local_358);
  cfd::core::Address::operator=(local_1a8,(Address *)local_320);
  core::Address::~Address((Address *)local_320);
  (__return_storage_ptr__->error).code = 0;
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_320);
  std::__cxx11::string::~string((string *)local_320);
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->locking_script);
  std::__cxx11::string::~string((string *)local_320);
  cVar3 = cfd::core::Script::IsEmpty();
  if (cVar3 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->redeem_script);
  }
  else {
    std::__cxx11::string::string((string *)local_320,"redeemScript",(allocator *)local_3e0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&__return_storage_ptr__->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  }
  std::__cxx11::string::~string((string *)local_320);
  core::Script::~Script((Script *)(local_3e0 + 0x18));
  core::Script::~Script(&local_390);
  core::Script::~Script(&local_358);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f8);
  core::Address::~Address(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

CreateAddressResponseStruct AddressApiBase::CreateAddress(
    const CreateAddressRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateAddressResponseStruct response;
  Address addr;
  Pubkey pubkey;
  Script script;
  Script locking_script;
  Script redeem_script;
  AddressType addr_type = ConvertAddressType(request.hash_type);

  if (request.key_data.type == "pubkey") {
    if ((addr_type == AddressType::kTaprootAddress) &&
        (request.key_data.hex.length() ==
         SchnorrPubkey::kSchnorrPubkeySize * 2)) {
      pubkey = SchnorrPubkey(request.key_data.hex).CreatePubkey();
    } else {
      pubkey = Pubkey(request.key_data.hex);
    }
  } else if (request.key_data.type == "redeem_script") {
    script = Script(request.key_data.hex);
  }

  addr = address_factory->CreateAddress(
      addr_type, &pubkey, &script, &locking_script, &redeem_script);

  response.error.code = 0;
  response.address = addr.GetAddress();
  response.locking_script = locking_script.GetHex();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  return response;
}